

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall
EmmyDebuggerManager::SetHitDebugger(EmmyDebuggerManager *this,shared_ptr<Debugger> *debugger)

{
  std::mutex::lock(&this->breakDebuggerMtx);
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>,
             &debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakDebuggerMtx);
  return;
}

Assistant:

void EmmyDebuggerManager::SetHitDebugger(std::shared_ptr<Debugger> debugger)
{
	std::lock_guard<std::mutex> lock(breakDebuggerMtx);
	hitDebugger = debugger;
}